

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_log_mfc(acmod_t *acmod,mfcc_t **cep,int n_frames)

{
  mfcc_t mVar1;
  mfcc_t *__ptr;
  ulong uVar2;
  size_t sVar3;
  size_t extraout_RAX;
  ulong __n;
  ulong uVar4;
  
  __ptr = *cep;
  __n = (long)n_frames * (long)acmod->fcb->cepsize;
  uVar4 = __n & 0x3fffffffffffffff;
  if (uVar4 != 0) {
    uVar2 = 0;
    do {
      mVar1 = __ptr[uVar2];
      __ptr[uVar2] = (mfcc_t)((uint)mVar1 >> 0x18 | ((uint)mVar1 & 0xff0000) >> 8 |
                              ((uint)mVar1 & 0xff00) << 8 | (int)mVar1 << 0x18);
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  sVar3 = fwrite(__ptr,4,__n,(FILE *)acmod->mfcfh);
  if (sVar3 != __n) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                   ,0x1e4,"Failed to write %d values to log file",__n);
    sVar3 = extraout_RAX;
  }
  if (uVar4 != 0) {
    sVar3 = 0;
    do {
      mVar1 = __ptr[sVar3];
      __ptr[sVar3] = (mfcc_t)((uint)mVar1 >> 0x18 | ((uint)mVar1 & 0xff0000) >> 8 |
                              ((uint)mVar1 & 0xff00) << 8 | (int)mVar1 << 0x18);
      sVar3 = sVar3 + 1;
    } while (uVar4 != sVar3);
  }
  return (int)sVar3;
}

Assistant:

static int
acmod_log_mfc(acmod_t *acmod,
              mfcc_t **cep, int n_frames)
{
    size_t i, n;
    int32 *ptr = (int32 *)cep[0];

    n = n_frames * feat_cepsize(acmod->fcb);
    /* Swap bytes. */
#ifndef WORDS_BIGENDIAN
    for (i = 0; i < (n * sizeof(mfcc_t) / sizeof(int32)); ++i) {
            SWAP_INT32(ptr + i);
    }
#endif
    /* Write features. */
    if (fwrite(cep[0], sizeof(mfcc_t), n, acmod->mfcfh) != n) {
        E_ERROR_SYSTEM("Failed to write %d values to log file", n);
    }

    /* Swap them back. */
#ifndef WORDS_BIGENDIAN
    for (i = 0; i < (n * sizeof(mfcc_t) / sizeof(int32)); ++i) {
        SWAP_INT32(ptr + i);
    }
#endif
    return 0;
}